

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

string * llvm::Triple::normalize_abi_cxx11_(StringRef Str)

{
  uint *puVar1;
  ulong __n;
  char *pcVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  ObjectFormatType Kind;
  ArchType AVar5;
  VendorType VVar6;
  EnvironmentType EVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  string *in_RDI;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  StringRef SVar17;
  StringRef SVar18;
  StringRef ArchName;
  StringRef OSName;
  StringRef VendorName;
  StringRef EnvironmentName;
  bool Found [4];
  SmallVector<llvm::StringRef,_4U> Components;
  StringRef CurrentComponent;
  string NormalizedEnvironment;
  StringRef AndroidVersion;
  bool local_124 [4];
  uint local_120;
  EnvironmentType local_11c;
  OSType local_118;
  uint local_114;
  ObjectFormatType local_110;
  VendorType local_10c;
  SmallVectorImpl<llvm::StringRef> local_108;
  StringRef local_f8 [4];
  string local_b8;
  string *local_98;
  uint *local_90;
  char *local_88;
  size_t sStack_80;
  char local_78;
  undefined7 uStack_77;
  StringRef local_68;
  StringRef local_58;
  Twine local_48;
  
  local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_f8;
  local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 4;
  StringRef::split(&local_58,&local_108,'-',-1,true);
  VVar6 = UnknownVendor;
  if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 0) {
    bVar16 = false;
  }
  else {
    AVar5 = parseArch(*local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX);
    bVar16 = AVar5 != UnknownArch;
  }
  uVar9 = local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  if (1 < local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
    VVar6 = parseVendor(*(StringRef *)
                         ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + 0x10));
  }
  local_118 = UnknownOS;
  local_120 = 0;
  local_114 = 0;
  if (2 < uVar9) {
    puVar1 = (uint *)((StringRef *)
                     ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + 0x20))->Data;
    uVar13 = ((StringRef *)
             ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                    BeginX + 0x20))->Length;
    local_118 = parseOS(*(StringRef *)
                         ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + 0x20));
    if (uVar13 < 6) {
      local_120 = 0;
    }
    else {
      local_120 = CONCAT31((int3)((*puVar1 ^ 0x77677963) >> 8),
                           (short)puVar1[1] == 0x6e69 && (*puVar1 ^ 0x77677963) == 0);
    }
    if (uVar13 < 5) {
      local_114 = 0;
    }
    else {
      local_114 = CONCAT31((int3)((*puVar1 ^ 0x676e696d) >> 8),
                           (char)puVar1[1] == 'w' && (*puVar1 ^ 0x676e696d) == 0);
    }
  }
  local_11c = UnknownEnvironment;
  if (3 < uVar9) {
    local_11c = parseEnvironment(*(StringRef *)
                                  ((long)local_108.
                                         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                         super_SmallVectorBase.BeginX + 0x30));
  }
  local_110 = UnknownObjectFormat;
  local_98 = in_RDI;
  if (4 < uVar9) {
    local_110 = parseFormat(*(StringRef *)
                             ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                    super_SmallVectorBase.BeginX + 0x40));
  }
  local_124[0] = bVar16;
  local_10c = VVar6;
  local_124[1] = VVar6 != UnknownVendor;
  local_124[2] = local_118 != UnknownOS;
  local_124[3] = local_11c != UnknownEnvironment;
  uVar13 = 0;
  do {
    if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size != 0 &&
        local_124[uVar13] == false) {
      uVar14 = 0;
      do {
        uVar9 = (uint)uVar14;
        if ((uVar9 < 4) && (local_124[uVar14] != false)) goto LAB_0016b806;
        if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
            uVar9) goto LAB_0016bbb6;
        if (3 < (uint)uVar13) {
          llvm_unreachable_internal
                    ("unexpected component type!",
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                     ,0x329);
        }
        puVar1 = (uint *)((StringRef *)
                         ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + uVar14 * 0x10))->Data;
        __n = ((StringRef *)
              ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX + uVar14 * 0x10))->Length;
        local_90 = puVar1;
        switch(uVar13 & 0xffffffff) {
        case 0:
          ArchName.Length = __n;
          ArchName.Data = (char *)puVar1;
          VVar6 = parseArch(ArchName);
          goto LAB_0016b5cd;
        case 1:
          VendorName.Length = __n;
          VendorName.Data = (char *)puVar1;
          VVar6 = parseVendor(VendorName);
          local_10c = VVar6;
LAB_0016b5cd:
          bVar16 = VVar6 != UnknownVendor;
          break;
        case 2:
          OSName.Length = __n;
          OSName.Data = (char *)puVar1;
          local_118 = parseOS(OSName);
          if (__n < 6) {
            local_120 = 0;
          }
          else {
            local_120 = CONCAT31((int3)((*puVar1 ^ 0x77677963) >> 8),
                                 (short)puVar1[1] == 0x6e69 && (*puVar1 ^ 0x77677963) == 0);
          }
          if (__n < 5) {
            local_114 = 0;
          }
          else {
            local_114 = CONCAT31((int3)((*puVar1 ^ 0x676e696d) >> 8),
                                 (char)puVar1[1] == 'w' && (*puVar1 ^ 0x676e696d) == 0);
          }
          bVar16 = (bool)((byte)local_114 | (byte)local_120 | local_118 != UnknownOS);
          break;
        case 3:
          SVar18.Length = __n;
          SVar18.Data = (char *)puVar1;
          EVar7 = parseEnvironment(SVar18);
          bVar16 = EVar7 != UnknownEnvironment;
          if (EVar7 == UnknownEnvironment) {
            EnvironmentName.Length = __n;
            EnvironmentName.Data = (char *)puVar1;
            local_110 = parseFormat(EnvironmentName);
            bVar16 = local_110 != UnknownObjectFormat;
            local_11c = UnknownEnvironment;
          }
          else {
            local_11c = EVar7;
          }
        }
        if (bVar16 != false) {
          if (uVar13 < uVar14) {
            if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
                uVar9) goto LAB_0016bbb6;
            pcVar11 = ((StringRef *)
                      ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX + uVar14 * 0x10))->Data;
            sVar10 = ((StringRef *)
                     ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + uVar14 * 0x10))->Length;
            ((StringRef *)
            ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX + uVar14 * 0x10))->Data = "";
            ((StringRef *)
            ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX + uVar14 * 0x10))->Length = 0;
            if (sVar10 != 0) {
              uVar12 = uVar13 & 0xffffffff;
              do {
                uVar9 = (uint)uVar12;
                if (uVar9 < 4) {
                  lVar15 = (3 - uVar9) + uVar12;
                  do {
                    if (local_124[uVar12] != true) {
                      uVar9 = (uint)uVar12;
                      goto LAB_0016b6c9;
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 != 4);
                  uVar9 = 4;
                  uVar12 = lVar15 + 1;
                }
LAB_0016b6c9:
                if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                    Size <= uVar9) goto LAB_0016bbb6;
                pcVar2 = ((StringRef *)
                         ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + uVar12 * 0x10))->Data;
                sVar3 = ((StringRef *)
                        ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + uVar12 * 0x10))->Length;
                ((StringRef *)
                ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX + uVar12 * 0x10))->Data = pcVar11;
                ((StringRef *)
                ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX + uVar12 * 0x10))->Length = sVar10;
                uVar12 = (ulong)(uVar9 + 1);
                sVar10 = sVar3;
                pcVar11 = pcVar2;
              } while (sVar3 != 0);
            }
          }
          else {
joined_r0x0016b701:
            if (uVar14 < uVar13) {
              local_b8._M_dataplus._M_p = "";
              local_b8._M_string_length = 0;
              uVar12 = uVar14;
              _Var4._M_p = local_b8._M_dataplus._M_p;
              sVar10 = local_b8._M_string_length;
              uVar9 = (uint)uVar14;
              while (local_b8._M_dataplus._M_p = _Var4._M_p, local_b8._M_string_length = sVar10,
                    uVar9 < local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.Size) {
                local_88 = _Var4._M_p;
                sStack_80 = sVar10;
                sVar3 = ((StringRef *)
                        ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + uVar12 * 0x10))->Length;
                local_b8._M_dataplus._M_p =
                     ((StringRef *)
                     ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + uVar12 * 0x10))->Data;
                local_b8._M_string_length = sVar3;
                ((StringRef *)
                ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX + uVar12 * 0x10))->Data = _Var4._M_p;
                ((StringRef *)
                ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX + uVar12 * 0x10))->Length = sVar10;
                if (sVar3 == 0) break;
                uVar9 = (int)uVar12 + 1;
                if (uVar9 < 5) {
                  uVar9 = 4;
                }
                do {
                  if (uVar9 - 1 == (int)uVar12) {
                    uVar12 = (ulong)uVar9;
                    break;
                  }
                  uVar12 = (ulong)((int)uVar12 + 1);
                } while (local_124[uVar12] != false);
                _Var4._M_p = local_b8._M_dataplus._M_p;
                sVar10 = local_b8._M_string_length;
                uVar9 = (uint)uVar12;
              }
              if (local_b8._M_string_length != 0) {
                SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                          (&local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>,
                           (StringRef *)&local_b8);
              }
              uVar9 = (uint)uVar14 + 1;
              if (uVar9 < 5) {
                uVar9 = 4;
              }
              do {
                if (uVar9 - 1 == (int)uVar14) {
                  uVar14 = (ulong)uVar9;
                  break;
                }
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (local_124[uVar14] != false);
              goto joined_r0x0016b701;
            }
          }
          if ((((local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                & 0xffffffff) <= uVar13) ||
              (((StringRef *)
               ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                      BeginX + uVar13 * 0x10))->Length != __n)) ||
             ((__n != 0 &&
              (iVar8 = bcmp(((StringRef *)
                            ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                   super_SmallVectorBase.BeginX + uVar13 * 0x10))->Data,local_90,__n
                           ), iVar8 != 0)))) {
            __assert_fail("Pos < Components.size() && Components[Pos] == Comp && \"Component moved wrong!\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                          ,0x374,"static std::string llvm::Triple::normalize(StringRef)");
          }
          local_124[uVar13] = true;
        }
        uVar9 = (uint)uVar14;
        if (bVar16 != false) break;
LAB_0016b806:
        uVar14 = (ulong)(uVar9 + 1);
      } while (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size !=
               uVar9 + 1);
    }
    Kind = local_110;
    uVar13 = uVar13 + 1;
  } while (uVar13 != 4);
  sStack_80 = 0;
  local_78 = '\0';
  local_88 = &local_78;
  if (local_11c == Android) {
    if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
    goto LAB_0016bbb6;
    if ((10 < ((StringRef *)
              ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX + 0x30))->Length) &&
       (*(long *)((long)((StringRef *)
                        ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                               super_SmallVectorBase.BeginX + 0x30))->Data + 3) ==
        0x6962616564696f72 &&
        *(long *)((StringRef *)
                 ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase
                        .BeginX + 0x30))->Data == 0x6564696f72646e61)) {
      local_68.Data =
           ((StringRef *)
           ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + 0x30))->Data + 0xb;
      local_68.Length =
           ((StringRef *)
           ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + 0x30))->Length - 0xb;
      if (local_68.Length == 0) {
        ((StringRef *)
        ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Data = "android";
        ((StringRef *)
        ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Length = 7;
      }
      else {
        Twine::Twine(&local_48,"android",&local_68);
        Twine::str_abi_cxx11_(&local_b8,&local_48);
        std::__cxx11::string::operator=((string *)&local_88,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        sVar10 = sStack_80;
        if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
        goto LAB_0016bbb6;
        ((StringRef *)
        ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Data = local_88;
        ((StringRef *)
        ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Length = sVar10;
      }
    }
  }
  if ((local_10c == SUSE) && (local_11c == GNUEABI)) {
    if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
    goto LAB_0016bbb6;
    ((StringRef *)
    ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x30))->Data = "gnueabihf";
    ((StringRef *)
    ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x30))->Length = 9;
  }
  if (local_118 == Win32) {
    SmallVectorImpl<llvm::StringRef>::resize(&local_108,4);
    if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
    goto LAB_0016bbb6;
    ((StringRef *)
    ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x20))->Data = "windows";
    ((StringRef *)
    ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x20))->Length = 7;
    if (local_11c == UnknownEnvironment) {
      if (Kind < ELF) {
        if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
        goto LAB_0016bbb6;
        SVar17.Length = 4;
        SVar17.Data = "msvc";
      }
      else {
        SVar17 = getObjectFormatTypeName(Kind);
        if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
        goto LAB_0016bbb6;
      }
      goto LAB_0016baa4;
    }
  }
  else {
    if ((local_114 & 1) == 0) {
      if ((local_120 & 1) == 0) goto LAB_0016baac;
      SmallVectorImpl<llvm::StringRef>::resize(&local_108,4);
      if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
      goto LAB_0016bbb6;
      ((StringRef *)
      ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Data = "windows";
      ((StringRef *)
      ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Length = 7;
      if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
      goto LAB_0016bbb6;
      SVar17.Length = 6;
      SVar17.Data = "cygnus";
    }
    else {
      SmallVectorImpl<llvm::StringRef>::resize(&local_108,4);
      if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
      goto LAB_0016bbb6;
      ((StringRef *)
      ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Data = "windows";
      ((StringRef *)
      ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Length = 7;
      if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
      goto LAB_0016bbb6;
      SVar17.Length = 3;
      SVar17.Data = "gnu";
    }
LAB_0016baa4:
    *(StringRef *)
     ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x30) = SVar17;
  }
LAB_0016baac:
  if ((((local_114 & 1) != 0) ||
      ((local_120 & 1) != 0 || local_11c != UnknownEnvironment && local_118 == Win32)) &&
     (COFF < Kind)) {
    SmallVectorImpl<llvm::StringRef>::resize(&local_108,5);
    SVar18 = getObjectFormatTypeName(Kind);
    if (local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 5) {
LAB_0016bbb6:
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    *(StringRef *)
     ((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x40) = SVar18;
  }
  (local_98->_M_dataplus)._M_p = (pointer)&local_98->field_2;
  local_98->_M_string_length = 0;
  (local_98->field_2)._M_local_buf[0] = '\0';
  uVar13 = local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
           0xffffffff;
  if (uVar13 != 0) {
    lVar15 = 8;
    uVar14 = 0;
    do {
      if (lVar15 != 8) {
        std::__cxx11::string::push_back((char)local_98);
      }
      if ((local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) <= uVar14) goto LAB_0016bbb6;
      std::__cxx11::string::append
                ((char *)local_98,
                 *(ulong *)((long)local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar15 + -8));
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar13 != uVar14);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if ((StringRef *)
      local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_f8) {
    free(local_108.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  return local_98;
}

Assistant:

std::string Triple::normalize(StringRef Str) {
  bool IsMinGW32 = false;
  bool IsCygwin = false;

  // Parse into components.
  SmallVector<StringRef, 4> Components;
  Str.split(Components, '-');

  // If the first component corresponds to a known architecture, preferentially
  // use it for the architecture.  If the second component corresponds to a
  // known vendor, preferentially use it for the vendor, etc.  This avoids silly
  // component movement when a component parses as (eg) both a valid arch and a
  // valid os.
  ArchType Arch = UnknownArch;
  if (Components.size() > 0)
    Arch = parseArch(Components[0]);
  VendorType Vendor = UnknownVendor;
  if (Components.size() > 1)
    Vendor = parseVendor(Components[1]);
  OSType OS = UnknownOS;
  if (Components.size() > 2) {
    OS = parseOS(Components[2]);
    IsCygwin = Components[2].startswith("cygwin");
    IsMinGW32 = Components[2].startswith("mingw");
  }
  EnvironmentType Environment = UnknownEnvironment;
  if (Components.size() > 3)
    Environment = parseEnvironment(Components[3]);
  ObjectFormatType ObjectFormat = UnknownObjectFormat;
  if (Components.size() > 4)
    ObjectFormat = parseFormat(Components[4]);

  // Note which components are already in their final position.  These will not
  // be moved.
  bool Found[4];
  Found[0] = Arch != UnknownArch;
  Found[1] = Vendor != UnknownVendor;
  Found[2] = OS != UnknownOS;
  Found[3] = Environment != UnknownEnvironment;

  // If they are not there already, permute the components into their canonical
  // positions by seeing if they parse as a valid architecture, and if so moving
  // the component to the architecture position etc.
  for (unsigned Pos = 0; Pos != array_lengthof(Found); ++Pos) {
    if (Found[Pos])
      continue; // Already in the canonical position.

    for (unsigned Idx = 0; Idx != Components.size(); ++Idx) {
      // Do not reparse any components that already matched.
      if (Idx < array_lengthof(Found) && Found[Idx])
        continue;

      // Does this component parse as valid for the target position?
      bool Valid = false;
      StringRef Comp = Components[Idx];
      switch (Pos) {
      default: llvm_unreachable("unexpected component type!");
      case 0:
        Arch = parseArch(Comp);
        Valid = Arch != UnknownArch;
        break;
      case 1:
        Vendor = parseVendor(Comp);
        Valid = Vendor != UnknownVendor;
        break;
      case 2:
        OS = parseOS(Comp);
        IsCygwin = Comp.startswith("cygwin");
        IsMinGW32 = Comp.startswith("mingw");
        Valid = OS != UnknownOS || IsCygwin || IsMinGW32;
        break;
      case 3:
        Environment = parseEnvironment(Comp);
        Valid = Environment != UnknownEnvironment;
        if (!Valid) {
          ObjectFormat = parseFormat(Comp);
          Valid = ObjectFormat != UnknownObjectFormat;
        }
        break;
      }
      if (!Valid)
        continue; // Nope, try the next component.

      // Move the component to the target position, pushing any non-fixed
      // components that are in the way to the right.  This tends to give
      // good results in the common cases of a forgotten vendor component
      // or a wrongly positioned environment.
      if (Pos < Idx) {
        // Insert left, pushing the existing components to the right.  For
        // example, a-b-i386 -> i386-a-b when moving i386 to the front.
        StringRef CurrentComponent(""); // The empty component.
        // Replace the component we are moving with an empty component.
        std::swap(CurrentComponent, Components[Idx]);
        // Insert the component being moved at Pos, displacing any existing
        // components to the right.
        for (unsigned i = Pos; !CurrentComponent.empty(); ++i) {
          // Skip over any fixed components.
          while (i < array_lengthof(Found) && Found[i])
            ++i;
          // Place the component at the new position, getting the component
          // that was at this position - it will be moved right.
          std::swap(CurrentComponent, Components[i]);
        }
      } else if (Pos > Idx) {
        // Push right by inserting empty components until the component at Idx
        // reaches the target position Pos.  For example, pc-a -> -pc-a when
        // moving pc to the second position.
        do {
          // Insert one empty component at Idx.
          StringRef CurrentComponent(""); // The empty component.
          for (unsigned i = Idx; i < Components.size();) {
            // Place the component at the new position, getting the component
            // that was at this position - it will be moved right.
            std::swap(CurrentComponent, Components[i]);
            // If it was placed on top of an empty component then we are done.
            if (CurrentComponent.empty())
              break;
            // Advance to the next component, skipping any fixed components.
            while (++i < array_lengthof(Found) && Found[i])
              ;
          }
          // The last component was pushed off the end - append it.
          if (!CurrentComponent.empty())
            Components.push_back(CurrentComponent);

          // Advance Idx to the component's new position.
          while (++Idx < array_lengthof(Found) && Found[Idx])
            ;
        } while (Idx < Pos); // Add more until the final position is reached.
      }
      assert(Pos < Components.size() && Components[Pos] == Comp &&
             "Component moved wrong!");
      Found[Pos] = true;
      break;
    }
  }

  // Special case logic goes here.  At this point Arch, Vendor and OS have the
  // correct values for the computed components.
  std::string NormalizedEnvironment;
  if (Environment == Triple::Android && Components[3].startswith("androideabi")) {
    StringRef AndroidVersion = Components[3].drop_front(strlen("androideabi"));
    if (AndroidVersion.empty()) {
      Components[3] = "android";
    } else {
      NormalizedEnvironment = Twine("android", AndroidVersion).str();
      Components[3] = NormalizedEnvironment;
    }
  }

  // SUSE uses "gnueabi" to mean "gnueabihf"
  if (Vendor == Triple::SUSE && Environment == llvm::Triple::GNUEABI)
    Components[3] = "gnueabihf";

  if (OS == Triple::Win32) {
    Components.resize(4);
    Components[2] = "windows";
    if (Environment == UnknownEnvironment) {
      if (ObjectFormat == UnknownObjectFormat || ObjectFormat == Triple::COFF)
        Components[3] = "msvc";
      else
        Components[3] = getObjectFormatTypeName(ObjectFormat);
    }
  } else if (IsMinGW32) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "gnu";
  } else if (IsCygwin) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "cygnus";
  }
  if (IsMinGW32 || IsCygwin ||
      (OS == Triple::Win32 && Environment != UnknownEnvironment)) {
    if (ObjectFormat != UnknownObjectFormat && ObjectFormat != Triple::COFF) {
      Components.resize(5);
      Components[4] = getObjectFormatTypeName(ObjectFormat);
    }
  }

  // Stick the corrected components back together to form the normalized string.
  std::string Normalized;
  for (unsigned i = 0, e = Components.size(); i != e; ++i) {
    if (i) Normalized += '-';
    Normalized += Components[i];
  }
  return Normalized;
}